

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O1

void SRCTools::ResamplerModel::freeResamplerModel
               (FloatSampleProvider *model,FloatSampleProvider *source)

{
  long lVar1;
  FloatSampleProvider *pFVar2;
  
  do {
    if (model == source) {
      return;
    }
    if (model == (FloatSampleProvider *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(model,&FloatSampleProvider::typeinfo,&CascadeStage::typeinfo,0);
    }
    pFVar2 = model;
    if ((lVar1 != 0) &&
       (pFVar2 = *(FloatSampleProvider **)(lVar1 + 0x10), model != (FloatSampleProvider *)0x0)) {
      (*model->_vptr_FloatSampleProvider[1])(model);
    }
    model = pFVar2;
  } while (lVar1 != 0);
  return;
}

Assistant:

void ResamplerModel::freeResamplerModel(FloatSampleProvider &model, FloatSampleProvider &source) {
	FloatSampleProvider *currentStage = &model;
	while (currentStage != &source) {
		CascadeStage *cascadeStage = dynamic_cast<CascadeStage *>(currentStage);
		if (cascadeStage == NULL) return;
		FloatSampleProvider &prevStage = cascadeStage->source;
		delete currentStage;
		currentStage = &prevStage;
	}
}